

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O0

int __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::AddItem(SDES *this,uint8_t *buf,size_t len)

{
  bool bVar1;
  reference ppSVar2;
  size_t len_local;
  uint8_t *buf_local;
  SDES *this_local;
  
  bVar1 = std::__cxx11::
          list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
          ::empty(&this->sdessources);
  if (bVar1) {
    this_local._4_4_ = -0x28;
  }
  else {
    ppSVar2 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::operator*
                        (&this->sdesit);
    SDESSource::AddItem(*ppSVar2,buf,len);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int AddItem(uint8_t *buf,size_t len)
		{
			if (sdessources.empty())
				return ERR_RTP_RTCPCOMPPACKBUILDER_NOCURRENTSOURCE;
			(*sdesit)->AddItem(buf,len);
			return 0;
		}